

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall
CGameClient::DoTeamChangeMessage(CGameClient *this,char *pName,int ClientID,int Team)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int in_ECX;
  long in_RDI;
  long in_FS_OFFSET;
  char aLabel [64];
  char aBuf [128];
  char *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  CGameClient *in_stack_ffffffffffffff00;
  undefined1 local_c8 [52];
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  CChat *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetPlayerLabel(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8);
  iVar2 = GetStrTeam(in_ECX,(bool)((byte)*(undefined4 *)(in_RDI + 0x1b15c) & 1));
  switch(iVar2) {
  case 0:
    pcVar3 = Localize((char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    str_format(&stack0xffffffffffffff78,0x80,pcVar3,local_c8);
    break;
  case 1:
    pcVar3 = &stack0xffffffffffffff78;
    pcVar4 = Localize(pcVar3,in_stack_fffffffffffffef8);
    str_format(pcVar3,0x80,pcVar4,local_c8);
    break;
  case 2:
    pcVar3 = &stack0xffffffffffffff78;
    pcVar4 = Localize((char *)in_stack_ffffffffffffff00,pcVar3);
    str_format(pcVar3,0x80,pcVar4,local_c8);
    break;
  case 3:
    pcVar3 = &stack0xffffffffffffff78;
    pcVar4 = Localize((char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    str_format(pcVar3,0x80,pcVar4,local_c8);
  }
  CChat::AddLine(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::DoTeamChangeMessage(const char *pName, int ClientID, int Team)
{
	char aBuf[128];
	char aLabel[64];
	GetPlayerLabel(aLabel, sizeof(aLabel), ClientID, pName);
	switch(GetStrTeam(Team, m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS))
	{
	case STR_TEAM_GAME: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the game"), aLabel); break;
	case STR_TEAM_RED: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the red team"), aLabel); break;
	case STR_TEAM_BLUE: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the blue team"), aLabel); break;
	case STR_TEAM_SPECTATORS: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the spectators"), aLabel); break;
	}
	m_pChat->AddLine(aBuf);
}